

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitStringConst(PrintExpressionContents *this,StringConst *curr)

{
  ostream *os;
  string_view str;
  StringConst *curr_local;
  PrintExpressionContents *this_local;
  
  printMedium(this->o,"string.const ");
  os = (ostream *)(curr->string).super_IString.str._M_len;
  str._M_str = (char *)os;
  str._M_len = (size_t)(curr->string).super_IString.str._M_str;
  anon_unknown_217::printEscapedString((anon_unknown_217 *)this->o,os,str);
  return;
}

Assistant:

void visitStringConst(StringConst* curr) {
    printMedium(o, "string.const ");
    printEscapedString(o, curr->string.str);
  }